

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSwitchEncoding(void)

{
  int iVar1;
  xmlCharEncoding val;
  int iVar2;
  xmlParserCtxtPtr val_00;
  int local_2c;
  int n_enc;
  xmlCharEncoding enc;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_enc = 0; n_enc < 3; n_enc = n_enc + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val_00 = gen_xmlParserCtxtPtr(n_enc,0);
      val = gen_xmlCharEncoding(local_2c,1);
      iVar2 = xmlSwitchEncoding(val_00,val);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlParserCtxtPtr(n_enc,val_00,0);
      des_xmlCharEncoding(local_2c,val,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSwitchEncoding",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)(uint)n_enc);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlSwitchEncoding(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlParserCtxtPtr ctxt; /* the parser context */
    int n_ctxt;
    xmlCharEncoding enc; /* the encoding value (number) */
    int n_enc;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
    for (n_enc = 0;n_enc < gen_nb_xmlCharEncoding;n_enc++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);
        enc = gen_xmlCharEncoding(n_enc, 1);

        ret_val = xmlSwitchEncoding(ctxt, enc);
        desret_int(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        des_xmlCharEncoding(n_enc, enc, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSwitchEncoding",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf(" %d", n_enc);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}